

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.hxx
# Opt level: O3

bool compare<double>(double *a,double *b,string *str,double epsilon)

{
  double dVar1;
  double dVar2;
  ostream *poVar3;
  
  dVar1 = *a;
  dVar2 = *b;
  if (epsilon <= ABS(dVar1 - dVar2)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in ",9);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(str->_M_dataplus)._M_p,str->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    poVar3 = std::ostream::_M_insert<double>(*a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    poVar3 = std::ostream::_M_insert<double>(*b);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  return ABS(dVar1 - dVar2) < epsilon;
}

Assistant:

inline bool compare(const T & a, const T & b, const std::string & str, double epsilon = 1e-12)
{
  if (fabs(a-b) >= epsilon)
  {
    std::cerr << "Error in "<< str << ":" << std::endl;
    std::cerr << a << std::endl << b << std::endl;
    return false;
  }
  return true;
}